

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O3

_Bool Hacl_Bignum64_mod(uint32_t len,uint64_t *n,uint64_t *a,uint64_t *res)

{
  size_t sVar1;
  uint64_t b;
  long lVar2;
  uint64_t *puVar3;
  uint64_t *a_00;
  uint64_t *n_00;
  void *pvVar4;
  uint32_t len_00;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t *res_00;
  void *__s;
  uint32_t nBits;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uStack_80;
  void *local_78;
  ulong local_70;
  uint64_t local_68;
  size_t local_60;
  uint64_t *local_58;
  uint64_t *local_50;
  uint64_t *local_48;
  void *local_40;
  uint32_t local_34;
  
  local_40 = (void *)(ulong)len;
  uVar7 = (long)local_40 * 8 + 0xfU & 0xfffffffffffffff0;
  lVar2 = -uVar7;
  __s = (void *)((long)&local_78 + lVar2);
  sVar1 = (long)local_40 * 8;
  local_78 = __s;
  local_70 = uVar7;
  local_60 = sVar1;
  local_48 = n;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x195309;
  memset(__s,0,sVar1);
  *(undefined8 *)((long)&local_78 - uVar7) = 1;
  local_34 = len;
  if (len != 0) {
    local_68 = *local_48;
    uVar7 = 0;
    uVar9 = 0;
    local_58 = res;
    local_50 = a;
    do {
      uVar6 = *(uint64_t *)((long)local_78 + uVar7 * 8);
      b = local_48[uVar7];
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x19534f;
      uVar5 = FStar_UInt64_eq_mask(uVar6,b);
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x19535d;
      uVar6 = FStar_UInt64_gte_mask(uVar6,b);
      pvVar4 = local_40;
      puVar3 = local_48;
      uVar9 = ~(uVar6 | uVar5) | uVar9 & uVar5;
      uVar7 = uVar7 + 1;
    } while (local_40 != (void *)uVar7);
    if (local_34 == 0) {
      nBits = 0;
    }
    else {
      uVar7 = 0;
      uVar8 = 0;
      do {
        uVar6 = puVar3[uVar7];
        *(undefined8 *)((long)&uStack_80 + lVar2) = 0x195396;
        uVar6 = FStar_UInt64_eq_mask(uVar6,0);
        uVar8 = (uVar8 ^ uVar7) & uVar6 ^ uVar7;
        uVar7 = uVar7 + 1;
      } while (pvVar4 != (void *)uVar7);
      nBits = (int)uVar8 << 6;
    }
    a_00 = local_50;
    puVar3 = local_58;
    sVar1 = local_60;
    res = local_58;
    if (((local_68 & 1) != 0) && (uVar9 == 0xffffffffffffffff)) {
      res_00 = (uint64_t *)((long)__s - local_70);
      local_40 = __s;
      res_00[-1] = 0x1953e0;
      memset(res_00,0,sVar1);
      len_00 = local_34;
      n_00 = local_48;
      res_00[-1] = 0x1953f9;
      Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len_00,nBits,n_00,res_00);
      uVar6 = *n_00;
      res_00[-1] = 0x195401;
      uVar6 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar6);
      res_00[-1] = 0x195418;
      bn_slow_precomp(len_00,n_00,uVar6,res_00,a_00,puVar3);
      return true;
    }
  }
  sVar1 = local_60;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x195432;
  memset(res,0,sVar1);
  return false;
}

Assistant:

bool Hacl_Bignum64_mod(uint32_t len, uint64_t *n, uint64_t *a, uint64_t *res)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t one[len];
  memset(one, 0U, len * sizeof (uint64_t));
  memset(one, 0U, len * sizeof (uint64_t));
  one[0U] = 1ULL;
  uint64_t bit0 = n[0U] & 1ULL;
  uint64_t m0 = 0ULL - bit0;
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(one[i], n[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(one[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  uint64_t m1 = acc;
  uint64_t is_valid_m = m0 & m1;
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(len, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t r2[len];
    memset(r2, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len, nBits, n, r2);
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    bn_slow_precomp(len, n, mu, r2, a, res);
  }
  else
  {
    memset(res, 0U, len * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}